

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestFlag TVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  UnitTestSource *pUVar7;
  TestFlag *pTVar8;
  Variable *pVVar9;
  UnitTest *pUVar10;
  uint uVar11;
  char *__s;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_224;
  AssertionHelper local_220;
  AssertionResult local_1f0;
  int local_1c4;
  char **local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  Type local_188;
  ios_base local_138 [264];
  
  local_1c4 = argc;
  pUVar7 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar7);
  iutest::TestEnv::ParseCommandLine<char>(&local_1c4,argv);
  iutest::TestEnv::LoadFlagFile();
  pUVar7 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar7);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"bar","");
  iutest::Test::RecordProperty<char[2]>((string *)local_1b8,(char (*) [2])0x128375);
  if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
  }
  local_1c0 = argv;
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  paVar1 = &local_220.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x656d616e;
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 4;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x68;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_1f0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x74736574;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 's';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 5;
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x69;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x6c696166;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'u';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 's';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 8;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6a;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x61736964;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'b';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'l';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 8;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6b;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x70696b73;
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 4;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6c;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x6f727265;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 's';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 6;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6d;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x656d6974;
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 4;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6e;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x656d6974;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 's';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 't';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'a';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'm';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = 'p';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 9;
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  TVar3.m_test_flags = local_224.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar3.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar4 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar4;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x6f;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_00132940;
  local_188 = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_224);
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x646e6172;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'o';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'm';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = '_';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 's';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xb;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::Test::RecordProperty<char[2]>((string *)&local_220,(char (*) [2])0x128375);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = local_224.m_test_flags;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       0x65736552;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[4] = 'r';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[5] = 'v';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[6] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[7] = 'd';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[8] = ' ';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[9] = 'k';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[10] = 'e';
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xb] = 'y';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0xc;
  local_220.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0xc] = '\0';
  local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1f0,(SPIFailureChecker *)local_1b8,(string *)&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[7],
                             CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_local_buf[6],
                                      CONCAT15(local_220.m_part_result.super_iuCodeMessage.m_message
                                               .field_2._M_local_buf[5],
                                               CONCAT14(local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_local_buf[4],
                                                        local_220.m_part_result.super_iuCodeMessage.
                                                        m_message.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_001329b0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  local_1b8._8_8_ = &PTR__ReporterHolder_001329d8;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = (TestPartResultReporterInterface *)local_1a8._0_8_;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_224);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x70;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT17(local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[7],
                               CONCAT16(local_220.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[6],
                                        CONCAT15(local_220.m_part_result.super_iuCodeMessage.
                                                 m_message.field_2._M_local_buf[5],
                                                 CONCAT14(local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_local_buf[4],
                                                          local_220.m_part_result.
                                                          super_iuCodeMessage.m_message.field_2.
                                                          _M_allocated_capacity._0_4_)))) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar7 = iutest::UnitTestSource::GetInstance();
  iVar6 = iutest::UnitTestSource::Run(pUVar7);
  uVar11 = 1;
  if (iVar6 == 0) {
    pUVar10 = iutest::UnitTest::instance();
    bVar5 = CheckProperty(&(pUVar10->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
    if (bVar5) {
      pUVar7 = iutest::UnitTestSource::GetInstance();
      iVar6 = iutest::UnitTestSource::Run(pUVar7);
      if (iVar6 != 0) {
        return 1;
      }
      pUVar10 = iutest::UnitTest::instance();
      bVar5 = CheckProperty(&(pUVar10->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
      if (bVar5) {
        pUVar7 = iutest::UnitTestSource::GetInstance();
        iutest::UnitTestSource::Initialize(pUVar7);
        iutest::TestEnv::ParseCommandLine<char>(&local_1c4,local_1c0);
        iutest::TestEnv::LoadFlagFile();
        pUVar7 = iutest::UnitTestSource::GetInstance();
        iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar7);
        pUVar7 = iutest::UnitTestSource::GetInstance();
        iVar6 = iutest::UnitTestSource::Run(pUVar7);
        if (iVar6 != 0) {
          return 1;
        }
        pUVar10 = iutest::UnitTest::instance();
        bVar5 = CheckProperty(&(pUVar10->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
        __s = "*** Successful ***";
        if (bVar5) {
          __s = "ad hoc test result is not cleared?";
        }
        uVar11 = (uint)bVar5;
      }
      else {
        uVar11 = 1;
        __s = "ad hoc test result is cleared?";
      }
    }
    else {
      uVar11 = 1;
      __s = "ad hoc test result is not recorded";
    }
    puts(__s);
  }
  return uVar11;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
    ::iutest::Test::RecordProperty("bar", "C");
#if !defined(IUTEST_USE_GTEST)
        // ban list
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("name"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("tests"      , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("failures"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("disabled"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("skip"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("errors"     , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("time"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("timestamp"  , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("random_seed", "C"), "Reserved key");
#endif

    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not recorded\n");
            return 1;
        }
#endif
    }
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared?\n");
            return 1;
        }
    }
    {
        IUTEST_INIT(&argc, argv);
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_USE_GTEST)
        if( CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not cleared?\n");
            return 1;
        }
#else
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared? (iutest expect)\n");
            return 1;
        }
#endif
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}